

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_functions.h
# Opt level: O0

void output_mat<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>
               (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *mat,ostream *stream)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  ostream *poVar4;
  uint local_20;
  uint local_1c;
  uint s;
  uint r;
  ostream *stream_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *mat_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size(mat);
    if (sVar1 <= local_1c) break;
    local_20 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](mat,(ulong)local_1c);
      sVar1 = std::vector<float,_std::allocator<float>_>::size(pvVar2);
      if (sVar1 <= local_20) break;
      pvVar2 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](mat,(ulong)local_1c);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](pvVar2,(ulong)local_20);
      poVar4 = (ostream *)std::ostream::operator<<(stream,*pvVar3);
      std::operator<<(poVar4," ");
      local_20 = local_20 + 1;
    }
    std::operator<<(stream,"\n");
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void output_mat(T mat, std::ostream & stream=std::clog) 
{
  for (unsigned int r = 0; r < mat.size(); ++ r)
  {
    for (unsigned int s = 0; s < mat[r].size(); ++s)
    {
      stream << mat[r][s] << " ";
    }
    stream << "\n";
  }
  return;
}